

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverMaxPlus.cpp
# Opt level: O1

void __thiscall
BGCG_SolverMaxPlus::BGCG_SolverMaxPlus
          (BGCG_SolverMaxPlus *this,shared_ptr<const_BayesianGameCollaborativeGraphical> *bgcg,
          size_t maxiter,string *updateType,int verbosity,double damping,size_t nrSolutions,
          size_t nrRestarts)

{
  pointer pcVar1;
  string local_50;
  
  BGCG_Solver::BGCG_Solver(&this->super_BGCG_Solver,bgcg,nrSolutions);
  pcVar1 = (updateType->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + updateType->_M_string_length);
  MaxPlusSolverForBGs::MaxPlusSolverForBGs
            (&this->super_MaxPlusSolverForBGs,maxiter,&local_50,verbosity,damping,nrSolutions,
             nrRestarts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_BGCG_Solver).super_BayesianGameIdenticalPayoffSolver.
  _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR_InitDeadline_0059eb78;
  return;
}

Assistant:

BGCG_SolverMaxPlus::BGCG_SolverMaxPlus(
            const boost::shared_ptr<const BayesianGameCollaborativeGraphical> &bgcg,                
            size_t maxiter,
            std::string updateType,
            int verbosity,
            double damping,
            size_t nrSolutions,
            size_t nrRestarts)
    :
        BGCG_Solver(bgcg,  nrSolutions),
        MaxPlusSolverForBGs(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
{
}